

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void startSemantic(ProgramNode *ast)

{
  FunctionListNode *pFVar1;
  VarTable *this;
  FunctionTable *this_00;
  StructTable *this_01;
  SemanticTypes semanticTypes;
  SemanticTables semanticVisitor;
  undefined **local_20;
  SemanticTables local_18;
  
  this = (VarTable *)operator_new(0x38);
  VarTable::VarTable(this);
  varTable = this;
  this_00 = (FunctionTable *)operator_new(0x38);
  FunctionTable::FunctionTable(this_00);
  functionTable = this_00;
  this_01 = (StructTable *)operator_new(0x38);
  StructTable::StructTable(this_01);
  local_18.super_VisitorAST._vptr_VisitorAST = (VisitorAST)&PTR__VisitorAST_00124e40;
  local_20 = &PTR__VisitorAST_00124fa8;
  structTable = this_01;
  SemanticTables::visit(&local_18,ast);
  pFVar1 = ast->functions;
  if (pFVar1 != (FunctionListNode *)0x0) {
    (*(pFVar1->super_ASTNode)._vptr_ASTNode[3])(pFVar1,&local_20);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void startSemantic(ProgramNode *ast) {
    varTable = new VarTable();
    functionTable = new FunctionTable();
    structTable = new StructTable();

    SemanticTables semanticVisitor;
    SemanticTypes semanticTypes;

    semanticVisitor.visit(ast);
    semanticTypes.visit(ast);
    fprintf(stderr, "\n");
}